

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O2

ParamGenerator<(anonymous_namespace)::TestVideoParam>
testing::ValuesIn<(anonymous_namespace)::TestVideoParam,3ul>
          (anon_struct_40_9_5a18a00c_for__M_head_impl (*array) [3])

{
  char *pcVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined **ppuVar5;
  byte bVar6;
  ParamGenerator<(anonymous_namespace)::TestVideoParam> PVar7;
  
  bVar6 = 0;
  pcVar1 = (char *)operator_new(0x20);
  *(undefined ***)pcVar1 = &PTR__ValuesInIteratorRangeGenerator_00f39a98;
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  pcVar1[0x10] = '\0';
  pcVar1[0x11] = '\0';
  pcVar1[0x12] = '\0';
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  pcVar1[0x18] = '\0';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  puVar2 = (undefined8 *)operator_new(0x78);
  *(undefined8 **)(pcVar1 + 8) = puVar2;
  *(undefined8 **)(pcVar1 + 0x18) = puVar2 + 0xf;
  ppuVar5 = &::(anonymous_namespace)::kTestVectors;
  puVar3 = puVar2;
  for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar3 = *ppuVar5;
    ppuVar5 = ppuVar5 + (ulong)bVar6 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
  }
  *(undefined8 **)(pcVar1 + 0x10) = puVar2 + 0xf;
  (*array)[0].filename = pcVar1;
  ((anon_struct_40_9_5a18a00c_for__M_head_impl *)((long)array + 0))->width = 0;
  ((anon_struct_40_9_5a18a00c_for__M_head_impl *)((long)array + 0))->height = 0;
  puVar3 = (undefined8 *)operator_new(0x18);
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_base_00f39b60;
  puVar3[2] = pcVar1;
  *(undefined8 **)&(*array)[0].width = puVar3;
  PVar7.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar7.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)array;
  return (ParamGenerator<(anonymous_namespace)::TestVideoParam>)
         PVar7.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestVideoParam>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}